

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_ws.hpp
# Opt level: O0

void __thiscall
SimpleWeb::
SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
::Connection::cancel_timeout(Connection *this)

{
  bool bVar1;
  pointer this_00;
  undefined1 local_20 [8];
  LockGuard lock;
  Connection *this_local;
  
  lock._8_8_ = this;
  LockGuard::LockGuard((LockGuard *)local_20,&this->timer_mutex);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->timer);
  if (bVar1) {
    this_00 = std::
              unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>
              ::operator->(&this->timer);
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::cancel(this_00);
  }
  LockGuard::~LockGuard((LockGuard *)local_20);
  return;
}

Assistant:

void cancel_timeout() noexcept {
        LockGuard lock(timer_mutex);
        if(timer) {
          try {
            timer->cancel();
          }
          catch(...) {
          }
        }
      }